

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

ConvertedFunction * __thiscall
dxil_spv::Converter::Impl::convert_entry_point(ConvertedFunction *__return_storage_ptr__,Impl *this)

{
  Vector<Function> *leaves;
  undefined1 uVar1;
  size_type sVar2;
  SPIRVModule *this_00;
  pointer ptr;
  ExecutionModel EVar3;
  int iVar4;
  Module *module;
  MDNode *pMVar5;
  Builder *this_01;
  CFGNodePool *pCVar6;
  LoggingCallback p_Var7;
  Function *pFVar8;
  void *pvVar9;
  CFGNode *entry;
  Function *pFVar10;
  MDNode *extraout_RDX;
  MDNode *extraout_RDX_00;
  uint32_t version;
  char *entry_00;
  String *this_02;
  bool bVar11;
  Function FVar12;
  Vector<LLVMBC::BasicBlock_*> patch_visit_order;
  Vector<LLVMBC::BasicBlock_*> visit_order;
  char buffer [4096];
  Vector<LLVMBC::BasicBlock_*> local_1078;
  Vector<LLVMBC::BasicBlock_*> local_1058;
  String *local_1040;
  undefined1 local_1038 [32];
  undefined1 local_1018;
  
  (__return_storage_ptr__->leaf_functions).
  super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->node_pool)._M_t.
  super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>._M_t.
  super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>.
  super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl = (CFGNodePool *)0x0;
  (__return_storage_ptr__->leaf_functions).
  super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->leaf_functions).
  super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->entry).entry = (CFGNode *)0x0;
  (__return_storage_ptr__->entry).func = (Function *)0x0;
  module = LLVMBCParser::get_module(this->bitcode_parser);
  entry_00 = (char *)(this->options).entry_point._M_string_length;
  if (entry_00 != (char *)0x0) {
    entry_00 = (this->options).entry_point._M_dataplus._M_p;
  }
  pMVar5 = get_entry_point_meta(module,entry_00);
  this->entry_point_meta = pMVar5;
  EVar3 = get_execution_model(module,pMVar5);
  this->execution_model = EVar3;
  local_1038._8_8_ = (CFGNode *)0x0;
  local_1038._16_8_ = local_1038._16_8_ & 0xffffffffffffff00;
  local_1038._0_8_ = local_1038 + 0x10;
  get_shader_model(module,(basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                           *)local_1038,(uint32_t *)0x0,(uint32_t *)0x0);
  iVar4 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)local_1038,"lib");
  if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
    free_in_thread((void *)local_1038._0_8_);
  }
  this->execution_model_lib_target = iVar4 == 0;
  version = 0x10600;
  if (iVar4 == 0 && this->execution_model == ExecutionModelGLCompute) {
LAB_00111f0d:
    SPIRVModule::set_override_spirv_version(this->spirv_module,version);
  }
  else if ((this->execution_model == ExecutionModelFragment) &&
          (this->resource_mapping_iface != (ResourceRemappingInterface *)0x0)) {
    iVar4 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[0xc])();
    version = 0x10400;
    if ((char)iVar4 != '\0') goto LAB_00111f0d;
  }
  if (this->entry_point_meta == (MDNode *)0x0) {
    sVar2 = (this->options).entry_point._M_string_length;
    p_Var7 = get_thread_log_callback();
    if (sVar2 == 0) {
      if (p_Var7 == (LoggingCallback)0x0) {
        convert_entry_point();
        return __return_storage_ptr__;
      }
      local_1038[0x10] = 'n';
      local_1038[0x11] = 'y';
      local_1038[0x12] = ' ';
      local_1038[0x13] = 'e';
      local_1038[0x14] = 'n';
      local_1038[0x15] = 't';
      local_1038[0x16] = 'r';
      local_1038[0x17] = 'y';
      local_1038[0x18] = ' ';
      local_1038[0x19] = 'p';
      local_1038[0x1a] = 'o';
      local_1038[0x1b] = 'i';
      local_1038[0x1c] = 'n';
      local_1038[0x1d] = 't';
      local_1038[0x1e] = '.';
      local_1038[0x1f] = '\n';
      local_1038[0] = 'C';
      local_1038[1] = 'o';
      local_1038[2] = 'u';
      local_1038[3] = 'l';
      local_1038[4] = 'd';
      local_1038[5] = ' ';
      local_1038[6] = 'n';
      local_1038[7] = 'o';
      local_1038[8] = 't';
      local_1038[9] = ' ';
      local_1038[10] = 'f';
      local_1038[0xb] = 'i';
      local_1038[0xc] = 'n';
      local_1038[0xd] = 'd';
      local_1038[0xe] = ' ';
      local_1038[0xf] = 'a';
      local_1018 = 0;
    }
    else {
      this_02 = &(this->options).entry_point;
      if (p_Var7 == (LoggingCallback)0x0) {
        convert_entry_point((Impl *)this_02);
        return __return_storage_ptr__;
      }
      snprintf(local_1038,0x1000,"Could not find entry point \"%s\".\n",(this_02->_M_dataplus)._M_p)
      ;
    }
    pvVar9 = get_thread_log_callback_userdata();
    (*p_Var7)(pvVar9,Error,local_1038);
    return __return_storage_ptr__;
  }
  if ((this->options).shader_source_file._M_string_length != 0) {
    local_1040 = &(this->options).shader_source_file;
    this_01 = SPIRVModule::get_builder(this->spirv_module);
    local_1038._0_8_ = local_1038._0_8_ & 0xffffffff00000000;
    local_1058.
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    get_shader_model(module,(String *)0x0,(uint32_t *)local_1038,(uint32_t *)&local_1058);
    this_01->source = SourceLanguageUnknown;
    this_01->sourceVersion =
         local_1038._0_4_ * 100 +
         (int)local_1058.
              super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    spv::Builder::setSourceFile(this_01,local_1040);
  }
  pCVar6 = (CFGNodePool *)allocate_in_thread(0x18);
  CFGNodePool::CFGNodePool(pCVar6);
  std::__uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>::reset
            ((__uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_> *)
             &__return_storage_ptr__->node_pool,pCVar6);
  bVar11 = true;
  if ((this->options).physical_storage_buffer == false) {
    if (this->execution_model_lib_target == true) {
      bVar11 = this->execution_model == ExecutionModelGLCompute;
    }
    else {
      bVar11 = false;
    }
  }
  pCVar6 = (__return_storage_ptr__->node_pool)._M_t.
           super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
           ._M_t.
           super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
           .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl;
  SPIRVModule::set_descriptor_qa_info(this->spirv_module,&(this->options).descriptor_qa);
  uVar1 = true;
  if ((this->options).min_precision_prefer_native_16bit == false) {
    uVar1 = (this->execution_mode_meta).native_16bit_operations;
  }
  (this->options).instruction_instrumentation.fp16 = (bool)uVar1;
  SPIRVModule::set_instruction_instrumentation_info
            (this->spirv_module,&(this->options).instruction_instrumentation);
  this_00 = this->spirv_module;
  EVar3 = get_execution_model(module,this->entry_point_meta);
  SPIRVModule::emit_entry_point(this_00,EVar3,"main",bVar11);
  pFVar8 = get_entry_point_function(this->entry_point_meta);
  build_function_bb_visit_order_legacy(&local_1058,this,pFVar8,pCVar6);
  local_1078.
  super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1078.
  super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1078.
  super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar11 = module_is_dxilconv(module);
  if (bVar11) {
    (this->options).min_precision_prefer_native_16bit = false;
  }
  analyze_execution_modes_meta(this);
  emit_resources_global_mapping(this);
  bVar11 = analyze_instructions(this,pFVar8);
  if ((!bVar11) || (bVar11 = emit_execution_modes(this), !bVar11)) goto LAB_001121db;
  pFVar8 = (this->execution_mode_meta).patch_constant_function;
  if (pFVar8 != (Function *)0x0) {
    build_function_bb_visit_order_legacy
              ((Vector<LLVMBC::BasicBlock_*> *)local_1038,this,pFVar8,pCVar6);
    ptr = local_1078.
          super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_start;
    local_1078.
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_1038._0_8_;
    local_1078.
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1038._8_8_;
    local_1078.
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1038._16_8_;
    local_1038._0_8_ = (pointer)0x0;
    local_1038._8_8_ = (CFGNode *)0x0;
    local_1038._16_8_ = 0;
    if (ptr != (pointer)0x0) {
      free_in_thread(ptr);
    }
    if ((pointer)local_1038._0_8_ != (pointer)0x0) {
      free_in_thread((void *)local_1038._0_8_);
    }
    bVar11 = analyze_instructions(this,(this->execution_mode_meta).patch_constant_function);
    if (!bVar11) goto LAB_001121db;
  }
  bVar11 = emit_resources(this);
  if ((((!bVar11) || (bVar11 = emit_stage_input_variables(this), !bVar11)) ||
      (bVar11 = emit_stage_output_variables(this), !bVar11)) ||
     (bVar11 = emit_patch_variables(this), !bVar11)) goto LAB_001121db;
  emit_other_variables(this);
  bVar11 = emit_global_variables(this);
  if (!bVar11) goto LAB_001121db;
  pMVar5 = extraout_RDX;
  if (this->execution_model == ExecutionModelFragment) {
    emit_execution_modes_pixel_late(this);
    pMVar5 = extraout_RDX_00;
  }
  if ((((this->shader_analysis).has_group_shared_barrier == false) &&
      ((this->shader_analysis).has_group_shared_access == true)) &&
     ((this->execution_mode_meta).workgroup_threads[1] *
      (this->execution_mode_meta).workgroup_threads[0] *
      (this->execution_mode_meta).workgroup_threads[2] - 2 < 0x1f)) {
    (this->shader_analysis).needs_auto_group_shared_barriers = true;
  }
  get_entry_point_name_abi_cxx11_((String *)local_1038,(dxil_spv *)this->entry_point_meta,pMVar5);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&(this->execution_mode_meta).entry_point_name,(String *)local_1038);
  if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
    free_in_thread((void *)local_1038._0_8_);
  }
  leaves = &__return_storage_ptr__->leaf_functions;
  if (this->execution_model == ExecutionModelTessellationControl) {
    FVar12 = build_hull_main(this,&local_1058,&local_1078,pCVar6,leaves);
LAB_00112344:
    pFVar10 = FVar12.func;
    (__return_storage_ptr__->entry).entry = FVar12.entry;
  }
  else {
    if ((this->execution_mode_meta).declares_rov == true) {
      FVar12 = build_rov_main(this,&local_1058,pCVar6,leaves);
      goto LAB_00112344;
    }
    if ((this->execution_model == ExecutionModelGLCompute) &&
       (this->execution_model_lib_target != false)) {
      FVar12 = build_node_main(this,&local_1058,pCVar6,leaves);
      goto LAB_00112344;
    }
    entry = convert_function(this,&local_1058,true);
    (__return_storage_ptr__->entry).entry = entry;
    if (((this->shader_analysis).needs_auto_group_shared_barriers == true) &&
       ((this->options).quirks.group_shared_auto_barrier == true)) {
      CFGStructurizer::CFGStructurizer
                ((CFGStructurizer *)local_1038,entry,pCVar6,this->spirv_module);
      CFGStructurizer::rewrite_auto_group_shared_barrier((CFGStructurizer *)local_1038);
      CFGStructurizer::~CFGStructurizer((CFGStructurizer *)local_1038);
    }
    if ((this->shader_analysis).require_subgroup_shuffles == true) {
      CFGStructurizer::CFGStructurizer
                ((CFGStructurizer *)local_1038,(__return_storage_ptr__->entry).entry,pCVar6,
                 this->spirv_module);
      CFGStructurizer::flatten_subgroup_shuffles((CFGStructurizer *)local_1038);
      CFGStructurizer::~CFGStructurizer((CFGStructurizer *)local_1038);
    }
    pFVar10 = SPIRVModule::get_entry_function(this->spirv_module);
  }
  (__return_storage_ptr__->entry).func = pFVar10;
  emit_execution_modes_post_code_generation(this);
LAB_001121db:
  if (local_1078.
      super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_1078.
                   super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_1058.
                       super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       (int)local_1058.
                            super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    free_in_thread((void *)CONCAT44(local_1058.
                                    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)local_1058.
                                         super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start));
  }
  return __return_storage_ptr__;
}

Assistant:

ConvertedFunction Converter::Impl::convert_entry_point()
{
	ConvertedFunction result = {};

	auto &module = bitcode_parser.get_module();
	entry_point_meta = get_entry_point_meta(module, options.entry_point.empty() ? nullptr : options.entry_point.c_str());
	execution_model = get_execution_model(module, entry_point_meta);
	execution_model_lib_target = get_execution_model_lib_target(module, entry_point_meta);

	if (execution_model_lib_target && execution_model == spv::ExecutionModelGLCompute)
	{
		// Might as well go with SPIR-V 1.6. Then we get subgroup size control semantics for "free".
		// When we're willing to do a clean break with Fossilize all shaders should target SPIR-V 1.6.
		spirv_module.set_override_spirv_version(0x10600);
	}
	else if (execution_model == spv::ExecutionModelFragment &&
	         resource_mapping_iface && resource_mapping_iface->has_nontrivial_stage_input_remapping())
	{
		// Force SPIR-V 1.4 for fragment shaders if we might end up requiring mesh shader capabilities.
		// Non-trivial stage input remapping may require PerPrimitiveEXT decoration.
		spirv_module.set_override_spirv_version(0x10400);
	}

	if (!entry_point_meta)
	{
		if (!options.entry_point.empty())
			LOGE("Could not find entry point \"%s\".\n", options.entry_point.c_str());
		else
			LOGE("Could not find any entry point.\n");
		return result;
	}

	if (!options.shader_source_file.empty())
	{
		auto &builder = spirv_module.get_builder();
		uint32_t sm_major = 0, sm_minor = 0;
		get_shader_model(module, nullptr, &sm_major, &sm_minor);
		builder.setSource(spv::SourceLanguageUnknown, sm_major * 100 + sm_minor);
		builder.setSourceFile(options.shader_source_file);
	}

	result.node_pool = std::make_unique<CFGNodePool>();
	auto &pool = *result.node_pool;

	bool need_bda =
		options.physical_storage_buffer ||
		(execution_model_lib_target &&
		 execution_model == spv::ExecutionModelGLCompute);

	spirv_module.set_descriptor_qa_info(options.descriptor_qa);
	options.instruction_instrumentation.fp16 =
	    options.min_precision_prefer_native_16bit || execution_mode_meta.native_16bit_operations;
	spirv_module.set_instruction_instrumentation_info(options.instruction_instrumentation);
	spirv_module.emit_entry_point(get_execution_model(module, entry_point_meta), "main", need_bda);

	llvm::Function *func = get_entry_point_function(entry_point_meta);
	auto visit_order = build_function_bb_visit_order_legacy(func, pool);
	Vector<llvm::BasicBlock *> patch_visit_order;

	// dxilconv emits somewhat broken code for min16float for resource access.
	// Just use FP32 here since that's what we've tested and avoids lots of awkward workarounds.
	if (module_is_dxilconv(module))
		options.min_precision_prefer_native_16bit = false;

	// Need to analyze some execution modes early which affect opcode analysis later.
	if (!analyze_execution_modes_meta())
		return result;
	if (!emit_resources_global_mapping())
		return result;
	if (!analyze_instructions(func))
		return result;

	if (!emit_execution_modes())
		return result;

	if (execution_mode_meta.patch_constant_function)
	{
		patch_visit_order = build_function_bb_visit_order_legacy(execution_mode_meta.patch_constant_function, pool);
		if (!analyze_instructions(execution_mode_meta.patch_constant_function))
			return result;
	}

	if (!emit_resources())
		return result;
	if (!emit_stage_input_variables())
		return result;
	if (!emit_stage_output_variables())
		return result;
	if (!emit_patch_variables())
		return result;
	if (!emit_other_variables())
		return result;
	if (!emit_global_variables())
		return result;

	// Some execution modes depend on other execution modes, so handle that here.
	if (!emit_execution_modes_late())
		return result;

	analyze_instructions_post_execution_modes();

	execution_mode_meta.entry_point_name = get_entry_point_name(entry_point_meta);

	if (execution_model == spv::ExecutionModelTessellationControl)
		result.entry = build_hull_main(visit_order, patch_visit_order, pool, result.leaf_functions);
	else if (execution_mode_meta.declares_rov)
		result.entry = build_rov_main(visit_order, pool, result.leaf_functions);
	else if (execution_model_lib_target && execution_model == spv::ExecutionModelGLCompute)
		result.entry = build_node_main(visit_order, pool, result.leaf_functions);
	else
	{
		result.entry.entry = convert_function(visit_order, true);
		if (shader_analysis.needs_auto_group_shared_barriers && options.quirks.group_shared_auto_barrier)
		{
			CFGStructurizer cfg{result.entry.entry, pool, spirv_module};
			cfg.rewrite_auto_group_shared_barrier();
		}

		if (shader_analysis.require_subgroup_shuffles)
		{
			CFGStructurizer cfg{result.entry.entry, pool, spirv_module};
			cfg.flatten_subgroup_shuffles();
		}

		result.entry.func = spirv_module.get_entry_function();
	}

	// Some execution modes depend on code generation, handle that here.
	emit_execution_modes_post_code_generation();

	return result;
}